

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_filter.c
# Opt level: O0

t_int * sigbiquad_perform(t_int *w)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  t_sample *ptVar6;
  t_int tVar7;
  int iVar8;
  float local_50;
  t_sample output;
  t_sample ff3;
  t_sample ff2;
  t_sample ff1;
  t_sample fb2;
  t_sample fb1;
  t_sample prev;
  t_sample last;
  int i;
  int n;
  t_biquadctl *c;
  t_sample *out;
  t_sample *in;
  t_int *w_local;
  
  ptVar6 = (t_sample *)w[3];
  tVar7 = w[4];
  fb1 = *ptVar6;
  fb2 = ptVar6[1];
  fVar1 = ptVar6[2];
  fVar2 = ptVar6[3];
  fVar3 = ptVar6[4];
  fVar4 = ptVar6[5];
  fVar5 = ptVar6[6];
  c = (t_biquadctl *)w[2];
  out = (t_sample *)w[1];
  for (prev = 0.0; (int)prev < (int)tVar7; prev = (t_sample)((int)prev + 1)) {
    local_50 = fVar2 * fb2 + fVar1 * fb1 + *out;
    iVar8 = PD_BIGORSMALL(local_50);
    if (iVar8 != 0) {
      local_50 = 0.0;
    }
    c->c_x1 = fVar5 * fb2 + fVar3 * local_50 + fVar4 * fb1;
    fb2 = fb1;
    fb1 = local_50;
    c = (t_biquadctl *)&c->c_x2;
    out = out + 1;
  }
  *ptVar6 = fb1;
  ptVar6[1] = fb2;
  return w + 5;
}

Assistant:

static t_int *sigbiquad_perform(t_int *w)
{
    t_sample *in = (t_sample *)(w[1]);
    t_sample *out = (t_sample *)(w[2]);
    t_biquadctl *c = (t_biquadctl *)(w[3]);
    int n = (int)w[4];
    int i;
    t_sample last = c->c_x1;
    t_sample prev = c->c_x2;
    t_sample fb1 = c->c_fb1;
    t_sample fb2 = c->c_fb2;
    t_sample ff1 = c->c_ff1;
    t_sample ff2 = c->c_ff2;
    t_sample ff3 = c->c_ff3;
    for (i = 0; i < n; i++)
    {
        t_sample output =  *in++ + fb1 * last + fb2 * prev;
        if (PD_BIGORSMALL(output))
            output = 0;
        *out++ = ff1 * output + ff2 * last + ff3 * prev;
        prev = last;
        last = output;
    }
    c->c_x1 = last;
    c->c_x2 = prev;
    return (w+5);
}